

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple.cpp
# Opt level: O0

Tuple * __thiscall
Tuple::namedToString
          (Tuple *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *names)

{
  size_type sVar1;
  reference pvVar2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDX;
  ulong local_40;
  size_t j;
  allocator local_22;
  undefined1 local_21;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_20;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *names_local;
  Tuple *this_local;
  string *res;
  
  local_21 = 0;
  local_20 = in_RDX;
  names_local = names;
  this_local = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)this,"",&local_22);
  std::allocator<char>::~allocator((allocator<char> *)&local_22);
  for (local_40 = 0;
      sVar1 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(names), local_40 < sVar1; local_40 = local_40 + 1) {
    if (local_40 != 0) {
      std::__cxx11::string::operator+=((string *)this," ");
    }
    pvVar2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](local_20,local_40);
    std::__cxx11::string::operator+=((string *)this,(string *)pvVar2);
    std::__cxx11::string::operator+=((string *)this,"=");
    pvVar2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](names,local_40);
    std::__cxx11::string::operator+=((string *)this,(string *)pvVar2);
  }
  return this;
}

Assistant:

string Tuple::namedToString(vector<string>& names)
{
  string res = "";
  for (size_t j = 0; j < data.size(); j++)
  {
   if (j)  res += " ";
   res += names[j];
   res += "=";
   res += data[j];
  }
  return res;
}